

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O1

API<Args::details::API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,Args::Command,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,false>
::addCommand<char_const(&)[5]>
          (API<Args::details::API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
           *__return_storage_ptr__,
          API<Args::CmdLine,Args::Command,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,false>
          *this,char (*name) [5],ValueOptions opt,bool isSubCommandRequired,String *desc,
          String *longDesc,String *defaultValue,String *valueSpecifier)

{
  Command *this_00;
  
  this_00 = (Command *)operator_new(0xf0);
  Command::Command<char_const(&)[5]>(this_00,name,opt,isSubCommandRequired);
  if (desc->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_description);
  }
  if (longDesc->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_longDescription);
  }
  if (defaultValue->_M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this_00->m_defaultValues,defaultValue);
  }
  if (valueSpecifier->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this_00->m_valueSpecifier);
  }
  (**(code **)(**(long **)(this + 0x10) + 0x98))();
  if (this_00 != (Command *)0x0) {
    (*(this_00->super_GroupIface).super_ArgIface._vptr_ArgIface[1])();
  }
  __return_storage_ptr__->_vptr_API = (_func_int **)&PTR__API_00172cc8;
  __return_storage_ptr__->m_parent =
       (API<Args::CmdLine,_Args::Command,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
        *)this;
  __return_storage_ptr__->m_self = this_00;
  return __return_storage_ptr__;
}

Assistant:

API< API< PARENT, Command, ARGPTR, false >, Command, ARGPTR, false > addCommand(
		//! Name of the group.
		NAME && name,
		//! Value type.
		ValueOptions opt = ValueOptions::NoValue,
		//! Is sub-command required?
		bool isSubCommandRequired = false,
		//! Description of the argument.
		const String & desc = String(),
		//! Long description.
		const String & longDesc = String(),
		//! Default value.
		const String & defaultValue = String(),
		//! Value specifier.
		const String & valueSpecifier = String() )
	{
		auto cmd = std::unique_ptr< Command, details::Deleter< ArgIface > > (
			new Command( std::forward< NAME > ( name ), opt, isSubCommandRequired ),
			details::Deleter< ArgIface > ( true ) );

		if( !desc.empty() )
			cmd->setDescription( desc );

		if( !longDesc.empty() )
			cmd->setLongDescription( longDesc );

		if( !defaultValue.empty() )
			cmd->setDefaultValue( defaultValue );

		if( !valueSpecifier.empty() )
			cmd->setValueSpecifier( valueSpecifier );

		Command & c = *cmd;

		ARGPTR arg = std::move( cmd );

		m_self.addArg( std::move( arg ) );

		return API< API< PARENT, Command, ARGPTR, false >, Command, ARGPTR, false > ( *this, c );
	}